

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp_math.cpp
# Opt level: O0

double getStandartDeviation(TRIPLERGB **mrx,int h,int w,int component,double E)

{
  byte bVar1;
  __type _Var2;
  undefined4 local_38;
  undefined4 local_34;
  int j;
  int i;
  double count;
  double E_local;
  int component_local;
  int w_local;
  int h_local;
  TRIPLERGB **mrx_local;
  
  _j = 0.0;
  for (local_34 = 0; local_34 < h; local_34 = local_34 + 1) {
    for (local_38 = 0; local_38 < w; local_38 = local_38 + 1) {
      bVar1 = getComponent((TRIPLEBYTES **)mrx,local_34,local_38,component);
      _Var2 = std::pow<double,int>((double)bVar1 - E,2);
      _j = _Var2 + _j;
    }
  }
  return _j / (double)(w * h);
}

Assistant:

double getStandartDeviation(TRIPLERGB **mrx, int h, int w, int component, double E) {
    double count = 0;
    for (int i = 0; i < h; i++) {
        for (int j = 0; j < w; j++) {
            count += pow((double) getComponent((TRIPLEBYTES **) mrx, i, j, component) - E, 2);
        }
    }
    return count / (w * h);
}